

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::set_rate_limit
          (session_impl *this,peer_class_t c,int channel,int limit)

{
  int *piVar1;
  int local_30;
  uint local_2c;
  peer_class *local_28;
  peer_class *pc;
  int limit_local;
  int channel_local;
  session_impl *this_local;
  peer_class_t c_local;
  
  if (((-1 < channel) && (channel < 2)) &&
     (local_2c = c.m_val, pc._0_4_ = limit, pc._4_4_ = channel, _limit_local = this,
     this_local._4_4_ = c.m_val, local_28 = peer_class_pool::at(&this->m_classes,c),
     local_28 != (peer_class *)0x0)) {
    if ((int)pc < 1) {
      pc._0_4_ = 0;
    }
    else {
      local_30 = ::std::numeric_limits<int>::max();
      local_30 = local_30 + -1;
      piVar1 = ::std::min<int>((int *)&pc,&local_30);
      pc._0_4_ = *piVar1;
    }
    bandwidth_channel::throttle
              ((bandwidth_channel *)(&local_28->priority + (long)pc._4_4_ * 3 + -7),(int)pc);
  }
  return;
}

Assistant:

void session_impl::set_rate_limit(peer_class_t c, int channel, int limit)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(limit >= -1);
		TORRENT_ASSERT(channel >= 0 && channel <= 1);

		if (channel < 0 || channel > 1) return;

		peer_class* pc = m_classes.at(c);
		if (pc == nullptr) return;
		if (limit <= 0) limit = 0;
		else limit = std::min(limit, std::numeric_limits<int>::max() - 1);
		pc->channel[channel].throttle(limit);
	}